

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O0

void __thiscall enact::BasicTypename::~BasicTypename(BasicTypename *this)

{
  BasicTypename *this_local;
  
  ~BasicTypename(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~BasicTypename() override = default;